

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccolor.c
# Opt level: O3

void cmyk_ycck_convert(j_compress_ptr cinfo,JSAMPARRAY input_buf,JSAMPIMAGE output_buf,
                      JDIMENSION output_row,int num_rows)

{
  uint uVar1;
  _func_void_j_compress_ptr *p_Var2;
  JSAMPROW pJVar3;
  JSAMPROW pJVar4;
  JSAMPROW pJVar5;
  JSAMPROW pJVar6;
  JSAMPROW pJVar7;
  bool bVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint local_3c;
  
  if (0 < num_rows) {
    p_Var2 = cinfo->cconvert[1].start_pass;
    uVar1 = cinfo->image_width;
    local_3c = output_row;
    do {
      if ((ulong)uVar1 != 0) {
        uVar11 = (ulong)local_3c;
        pJVar3 = (*output_buf)[uVar11];
        pJVar4 = output_buf[1][uVar11];
        pJVar5 = output_buf[2][uVar11];
        pJVar6 = output_buf[3][uVar11];
        pJVar7 = *input_buf;
        uVar11 = 0;
        do {
          uVar12 = (ulong)(pJVar7[uVar11 * 4] ^ 0xff);
          uVar9 = (ulong)(pJVar7[uVar11 * 4 + 1] ^ 0xff);
          uVar10 = (ulong)(pJVar7[uVar11 * 4 + 2] ^ 0xff);
          pJVar6[uVar11] = pJVar7[uVar11 * 4 + 3];
          pJVar3[uVar11] =
               (JSAMPLE)((uint)(*(int *)(p_Var2 + uVar9 * 8 + 0x800) + *(int *)(p_Var2 + uVar12 * 8)
                               + *(int *)(p_Var2 + uVar10 * 8 + 0x1000)) >> 0x10);
          pJVar4[uVar11] =
               (JSAMPLE)((uint)(*(int *)(p_Var2 + uVar9 * 8 + 0x2000) +
                                *(int *)(p_Var2 + uVar12 * 8 + 0x1800) +
                               *(int *)(p_Var2 + uVar10 * 8 + 0x2800)) >> 0x10);
          pJVar5[uVar11] =
               (JSAMPLE)((uint)(*(int *)(p_Var2 + uVar9 * 8 + 0x3000) +
                                *(int *)(p_Var2 + uVar12 * 8 + 0x2800) +
                               *(int *)(p_Var2 + uVar10 * 8 + 0x3800)) >> 0x10);
          uVar11 = uVar11 + 1;
        } while (uVar1 != uVar11);
      }
      input_buf = input_buf + 1;
      local_3c = local_3c + 1;
      bVar8 = 1 < num_rows;
      num_rows = num_rows + -1;
    } while (bVar8);
  }
  return;
}

Assistant:

METHODDEF(void)
cmyk_ycck_convert (j_compress_ptr cinfo,
		   JSAMPARRAY input_buf, JSAMPIMAGE output_buf,
		   JDIMENSION output_row, int num_rows)
{
  my_cconvert_ptr cconvert = (my_cconvert_ptr) cinfo->cconvert;
  register int r, g, b;
  register INT32 * ctab = cconvert->rgb_ycc_tab;
  register JSAMPROW inptr;
  register JSAMPROW outptr0, outptr1, outptr2, outptr3;
  register JDIMENSION col;
  JDIMENSION num_cols = cinfo->image_width;

  while (--num_rows >= 0) {
    inptr = *input_buf++;
    outptr0 = output_buf[0][output_row];
    outptr1 = output_buf[1][output_row];
    outptr2 = output_buf[2][output_row];
    outptr3 = output_buf[3][output_row];
    output_row++;
    for (col = 0; col < num_cols; col++) {
      r = MAXJSAMPLE - GETJSAMPLE(inptr[0]);
      g = MAXJSAMPLE - GETJSAMPLE(inptr[1]);
      b = MAXJSAMPLE - GETJSAMPLE(inptr[2]);
      /* K passes through as-is */
      outptr3[col] = inptr[3];	/* don't need GETJSAMPLE here */
      inptr += 4;
      /* If the inputs are 0..MAXJSAMPLE, the outputs of these equations
       * must be too; we do not need an explicit range-limiting operation.
       * Hence the value being shifted is never negative, and we don't
       * need the general RIGHT_SHIFT macro.
       */
      /* Y */
      outptr0[col] = (JSAMPLE)
		((ctab[r+R_Y_OFF] + ctab[g+G_Y_OFF] + ctab[b+B_Y_OFF])
		 >> SCALEBITS);
      /* Cb */
      outptr1[col] = (JSAMPLE)
		((ctab[r+R_CB_OFF] + ctab[g+G_CB_OFF] + ctab[b+B_CB_OFF])
		 >> SCALEBITS);
      /* Cr */
      outptr2[col] = (JSAMPLE)
		((ctab[r+R_CR_OFF] + ctab[g+G_CR_OFF] + ctab[b+B_CR_OFF])
		 >> SCALEBITS);
    }
  }
}